

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpj.cpp
# Opt level: O1

void __thiscall pg::FPJSolver::runSeq(FPJSolver *this)

{
  ulong *puVar1;
  uint uVar2;
  int *piVar3;
  char cVar4;
  bool bVar5;
  void *pvVar6;
  void *__s;
  void *__s_00;
  uint *__s_01;
  void *pvVar7;
  long lVar8;
  ostream *poVar9;
  long *plVar10;
  Game *pGVar11;
  bool bVar12;
  ulong uVar13;
  uint uVar14;
  uint *puVar15;
  ulong uVar16;
  uint uVar17;
  undefined4 uVar18;
  ulong uVar19;
  ulong uVar20;
  int to;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  int local_88;
  _label_vertex local_48;
  long local_38;
  
  pGVar11 = (this->super_Solver).game;
  pvVar6 = operator_new__(-(ulong)((ulong)pGVar11->n_vertices >> 0x3e != 0) |
                          pGVar11->n_vertices << 2);
  uVar27 = pGVar11->n_vertices + 0x3f;
  uVar26 = uVar27 >> 3 & 0xfffffffffffffff8;
  __s = operator_new__(uVar26);
  if (0x3f < uVar27) {
    memset(__s,0,uVar26);
  }
  uVar26 = pGVar11->n_vertices + 0x3f;
  uVar27 = uVar26 >> 3 & 0x1ffffffffffffff8;
  __s_00 = operator_new__(uVar27);
  if (0x3f < uVar26) {
    memset(__s_00,0,uVar27);
  }
  uVar26 = pGVar11->n_vertices + 0x3f;
  uVar27 = uVar26 >> 3 & 0x1ffffffffffffff8;
  __s_01 = (uint *)operator_new__(uVar27);
  if (0x3f < uVar26) {
    memset(__s_01,0,uVar27);
  }
  uVar26 = pGVar11->n_vertices;
  if (0 < (long)uVar26) {
    piVar3 = pGVar11->_priority;
    uVar27 = 0;
    do {
      uVar26 = uVar27 >> 6;
      uVar19 = 1L << (uVar27 & 0x3f);
      if ((*(byte *)(piVar3 + uVar27) & 1) == 0) {
        uVar19 = ~uVar19 & *(ulong *)(__s_01 + uVar26 * 2);
      }
      else {
        uVar19 = uVar19 | *(ulong *)(__s_01 + uVar26 * 2);
      }
      *(ulong *)(__s_01 + uVar26 * 2) = uVar19;
      uVar27 = uVar27 + 1;
      uVar26 = pGVar11->n_vertices;
    } while ((long)uVar27 < (long)uVar26);
  }
  pvVar7 = operator_new__((uVar26 & 0xffffffff) << 2);
  uVar24 = *__s_01 & 1;
  local_88 = 0;
  uVar25 = 0;
  uVar14 = 0;
  bVar12 = false;
  do {
    uVar26 = (ulong)(int)uVar14;
    if (((this->super_Solver).game)->n_vertices == uVar26) {
LAB_0015b395:
      if (bVar12) {
        while (local_88 != 0) {
          lVar8 = (long)local_88;
          local_88 = local_88 + -1;
          local_38 = (long)*(int *)((long)pvVar7 + lVar8 * 4 + -4);
          pGVar11 = (this->super_Solver).game;
          piVar3 = pGVar11->_inedges;
          lVar8 = (long)pGVar11->_firstins[local_38];
          uVar17 = piVar3[lVar8];
          if (uVar17 != 0xffffffff) {
            puVar15 = (uint *)(piVar3 + lVar8 + 1);
            do {
              uVar26 = (ulong)(long)(int)uVar17 >> 6;
              if ((((((this->super_Solver).disabled)->_bits[uVar26] >> ((ulong)uVar17 & 0x3f) & 1)
                    == 0) &&
                  (uVar27 = 1L << ((ulong)uVar17 & 0x3f),
                  (*(ulong *)((long)__s + uVar26 * 8) & uVar27) != 0)) &&
                 ((iVar22 = *(int *)((long)pvVar6 + (long)(int)uVar17 * 4), iVar22 == -1 ||
                  (iVar22 == (int)local_38)))) {
                if (1 < (this->super_Solver).trace) {
                  poVar9 = (this->super_Solver).logger;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar9,"\x1b[31;1mresetting\x1b[m ",0x14);
                  local_48.g = (this->super_Solver).game;
                  local_48.v = uVar17;
                  poVar9 = operator<<(poVar9,&local_48);
                  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
                  std::ostream::put((char)poVar9);
                  std::ostream::flush();
                }
                uVar27 = ~uVar27;
                puVar1 = (ulong *)((long)__s + uVar26 * 8);
                *puVar1 = *puVar1 & uVar27;
                puVar1 = (ulong *)((long)__s_00 + uVar26 * 8);
                *puVar1 = *puVar1 & uVar27;
                lVar8 = (long)local_88;
                local_88 = local_88 + 1;
                *(uint *)((long)pvVar7 + lVar8 * 4) = uVar17;
                if ((int)uVar17 < (int)uVar14) {
                  uVar14 = uVar17;
                }
              }
              uVar17 = *puVar15;
              puVar15 = puVar15 + 1;
            } while (uVar17 != 0xffffffff);
          }
        }
        if ((this->super_Solver).trace != 0) {
          poVar9 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"restarting after finding distractions of prio ",0x2e);
          plVar10 = (long *)std::ostream::operator<<
                                      (poVar9,((this->super_Solver).game)->_priority
                                              [(long)(int)uVar14 + -1]);
          std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
          std::ostream::put((char)plVar10);
          std::ostream::flush();
        }
        this->iterations = this->iterations + 1;
        if ((int)uVar25 <= (int)uVar14) {
          uVar14 = uVar25;
        }
        bVar12 = false;
      }
      else if ((int)uVar25 < (int)uVar14) {
        uVar26 = (ulong)(int)uVar25;
        do {
          uVar27 = uVar26 >> 6;
          if ((((this->super_Solver).disabled)->_bits[uVar27] >> (uVar26 & 0x3f) & 1) == 0) {
            uVar13 = 1L << (uVar26 & 0x3f);
            uVar19 = *(ulong *)((long)__s + uVar27 * 8);
            if (((uVar19 & uVar13) == 0) &&
               (*(ulong *)((long)__s + uVar27 * 8) = uVar19 | uVar13, 1 < (this->super_Solver).trace
               )) {
              poVar9 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"\x1b[38;5;165;1mjustified\x1b[m ",0x1a);
              local_48.g = (this->super_Solver).game;
              local_48.v = (int)uVar26;
              operator<<(poVar9,&local_48);
              if (*(int *)((long)pvVar6 + uVar26 * 4) != -1) {
                poVar9 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," => ",4);
                local_48.v = *(uint *)((long)pvVar6 + uVar26 * 4);
                local_48.g = (this->super_Solver).game;
                operator<<(poVar9,&local_48);
              }
              poVar9 = (this->super_Solver).logger;
              cVar4 = (char)poVar9;
              std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar4);
              std::ostream::put(cVar4);
              std::ostream::flush();
            }
          }
          uVar26 = uVar26 + 1;
        } while (uVar14 != (uint)uVar26);
      }
      uVar26 = (ulong)(int)uVar14;
      bVar5 = true;
      if (((this->super_Solver).game)->n_vertices != uVar26) {
        uVar24 = (uint)((*(ulong *)(__s_01 + (uVar26 >> 6) * 2) >> (uVar26 & 0x3f) & 1) != 0);
        uVar25 = uVar14;
LAB_0015b735:
        uVar19 = (ulong)(int)uVar14;
        uVar27 = uVar19 >> 6;
        uVar26 = *(ulong *)((long)__s + uVar27 * 8);
        if ((uVar26 >> (uVar19 & 0x3f) & 1) == 0) {
          uVar13 = 1L << (uVar19 & 0x3f);
          pGVar11 = (this->super_Solver).game;
          piVar3 = pGVar11->_outedges;
          lVar8 = (long)pGVar11->_firstouts[uVar19];
          uVar17 = piVar3[lVar8];
          uVar21 = (ulong)uVar17;
          if (((pGVar11->_owner)._bits[uVar27] & uVar13) == 0) {
            if (uVar17 == 0xffffffff) {
              uVar18 = 0xffffffff;
              uVar17 = 1;
            }
            else {
              puVar15 = (uint *)(piVar3 + lVar8 + 1);
              uVar17 = 1;
              uVar20 = 0xffffffff;
              do {
                uVar16 = (ulong)(long)(int)uVar21 >> 6;
                iVar22 = 0x11;
                if ((((this->super_Solver).disabled)->_bits[uVar16] >> (uVar21 & 0x3f) & 1) == 0) {
                  uVar23 = 1L << (uVar21 & 0x3f);
                  bVar5 = ((*(ulong *)((long)__s_00 + uVar16 * 8) & uVar23) != 0) ==
                          ((*(ulong *)(__s_01 + uVar16 * 2) & uVar23) != 0);
                  if (bVar5) {
                    uVar17 = 0;
                    uVar20 = uVar21;
                  }
                  iVar22 = 0xf;
                  if (!bVar5) {
                    iVar22 = 0;
                  }
                }
                uVar18 = (undefined4)uVar20;
                if ((iVar22 != 0x11) && (iVar22 != 0)) break;
                uVar2 = *puVar15;
                uVar21 = (ulong)uVar2;
                puVar15 = puVar15 + 1;
              } while (uVar2 != 0xffffffff);
            }
          }
          else if (uVar17 == 0xffffffff) {
            uVar18 = 0xffffffff;
            uVar17 = 0;
          }
          else {
            puVar15 = (uint *)(piVar3 + lVar8 + 1);
            uVar17 = 0;
            uVar20 = 0xffffffff;
            do {
              uVar16 = (ulong)(long)(int)uVar21 >> 6;
              iVar22 = 0x14;
              if ((((this->super_Solver).disabled)->_bits[uVar16] >> (uVar21 & 0x3f) & 1) == 0) {
                uVar23 = 1L << (uVar21 & 0x3f);
                bVar5 = ((*(ulong *)((long)__s_00 + uVar16 * 8) & uVar23) != 0) !=
                        ((*(ulong *)(__s_01 + uVar16 * 2) & uVar23) != 0);
                if (bVar5) {
                  uVar17 = 1;
                  uVar20 = uVar21;
                }
                iVar22 = 0;
                if (bVar5) {
                  iVar22 = 0x12;
                }
              }
              uVar18 = (undefined4)uVar20;
              if ((iVar22 != 0x14) && (iVar22 != 0)) break;
              uVar2 = *puVar15;
              uVar21 = (ulong)uVar2;
              puVar15 = puVar15 + 1;
            } while (uVar2 != 0xffffffff);
          }
          *(undefined4 *)((long)pvVar6 + uVar19 * 4) = uVar18;
          if (uVar24 != uVar17) {
            lVar8 = (long)local_88;
            local_88 = local_88 + 1;
            *(uint *)((long)pvVar7 + lVar8 * 4) = uVar14;
            puVar1 = (ulong *)((long)__s_00 + uVar27 * 8);
            *puVar1 = *puVar1 | uVar13;
            *(ulong *)((long)__s + uVar27 * 8) = uVar26 | uVar13;
            bVar12 = true;
            if (1 < (this->super_Solver).trace) {
              poVar9 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar9,"\x1b[38;5;165;1mjustified*\x1b[m ",0x1b);
              local_48.g = (this->super_Solver).game;
              local_48.v = uVar14;
              operator<<(poVar9,&local_48);
              if (*(int *)((long)pvVar6 + uVar19 * 4) != -1) {
                poVar9 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," => ",4);
                local_48.v = *(uint *)((long)pvVar6 + uVar19 * 4);
                local_48.g = (this->super_Solver).game;
                operator<<(poVar9,&local_48);
              }
              poVar9 = (this->super_Solver).logger;
              cVar4 = (char)poVar9;
              std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar4);
              std::ostream::put(cVar4);
              std::ostream::flush();
            }
          }
          uVar14 = uVar14 + 1;
          bVar5 = false;
        }
        else {
          uVar14 = uVar14 + 1;
          bVar5 = false;
        }
      }
    }
    else {
      if ((((this->super_Solver).disabled)->_bits[uVar26 >> 6] >> (uVar26 & 0x3f) & 1) == 0) {
        if (uVar24 != ((*(ulong *)(__s_01 + (uVar26 >> 6) * 2) & 1L << (uVar26 & 0x3f)) != 0))
        goto LAB_0015b395;
        goto LAB_0015b735;
      }
      uVar14 = uVar14 + 1;
      bVar5 = false;
    }
    if (bVar5) {
      pGVar11 = (this->super_Solver).game;
      if (0 < pGVar11->n_vertices) {
        uVar26 = 0;
        do {
          uVar27 = uVar26 >> 6;
          if ((((this->super_Solver).disabled)->_bits[uVar27] >> (uVar26 & 0x3f) & 1) == 0) {
            uVar19 = 1L << (uVar26 & 0x3f);
            bVar12 = ((*(ulong *)((long)__s_00 + uVar27 * 8) & uVar19) != 0) !=
                     ((*(ulong *)(__s_01 + uVar27 * 2) & uVar19) != 0);
            iVar22 = -1;
            if (bVar12 != (((pGVar11->_owner)._bits[uVar27] >> (uVar26 & 0x3f) & 1) == 0)) {
              iVar22 = *(int *)((long)pvVar6 + uVar26 * 4);
            }
            Oink::solve((this->super_Solver).oink,(int)uVar26,(uint)bVar12,iVar22);
          }
          uVar26 = uVar26 + 1;
          pGVar11 = (this->super_Solver).game;
        } while ((long)uVar26 < pGVar11->n_vertices);
      }
      operator_delete__(pvVar6);
      poVar9 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"solved with ",0xc);
      poVar9 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," iterations.",0xc);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      operator_delete__(pvVar7);
      operator_delete__(__s_01);
      operator_delete__(__s_00);
      operator_delete__(__s);
      return;
    }
  } while( true );
}

Assistant:

void
FPJSolver::runSeq()
{
    /**
     * Allocate and initialize data structures
     */

    int *strategy = new int[nodecount()]; // the current strategy
    bitset justified(nodecount()); // whether a vertex is justified
    bitset distraction(nodecount()); // whether a vertex is won by the opponent

    bitset parity(nodecount()); // optimization: precompute the parity of every vertex's priority
    for (int v=0; v<nodecount(); v++) parity[v] = priority(v)&1;

    uintqueue Q(nodecount());

    /**
     * Initialize loop
     */

    bool blockchanged = false; // did the current block change (new distractions)
    int cur_parity = parity[0]; // parity of current block
    int i = 0; // the current vertex
    int blockstart = 0; // first vertex of the current block

    for (;;) {
        /**
         * First detect if we are at the end of a block (vertices of same parity)
         */
        bool blockended = false;
        if (i == nodecount()) {
            blockended = true;
        } else {
            if (disabled[i]) { i++; continue; }
            if (parity[i] != cur_parity) blockended = true;
        }

        if (blockended) {
            if (blockchanged) {
                /**
                 * We have to reset all justified vertices that are now no longer justified...
                 */
                while (!Q.empty()) {
                    const int v = Q.pop();
                    for (auto curedge = ins(v); *curedge != -1; curedge++) {
                        const int from = *curedge;
                        if (disabled[from]) continue;
                        if (justified[from]) {
                            if (strategy[from] == -1 or strategy[from] == v) {
#ifndef NDEBUG
                                if (trace >= 2) logger << "\033[31;1mresetting\033[m " << label_vertex(from) << std::endl;
#endif
                                justified[from] = false;
                                distraction[from] = false; // reset it
                                Q.push(from);
                                if (from < i) i = from; // afterwards, continue at lowest unjustified vertex
                            }
                        }
                    }
                }
#ifndef NDEBUG
                if (trace) logger << "restarting after finding distractions of prio " << priority(i-1) << std::endl;
#endif
                iterations++;
                blockchanged = false;
                if (i > blockstart) i = blockstart;
            } else {
                // We now know that the current strategy of all unjustified vertices of the block is justified
                for (int v=blockstart; v<i; v++) {
                    if (!disabled[v] and !justified[v]) {
                        justified[v] = true;
#ifndef NDEBUG
                        if (trace >= 2) {
                            logger << "\033[38;5;165;1mjustified\033[m " << label_vertex(v);
                            if (strategy[v] != -1) logger << " => " << label_vertex(strategy[v]);
                            logger << std::endl;
                        }
#endif
                    }
                }
            }

            if (i == nodecount()) break; // in case the last block didn't result in unjustifications

            // continue with the new block, update the current parity
            cur_parity = parity[i];
            blockstart = i;
        }

        // if the current vertex is justified, we don't need to check it
        if (justified[i]) {
            i++;
            continue;
        }

        // compute one step winner of <i> and update the strategy
        int onestep_winner, str = -1;
        if (owner(i) == 0) {
            // see if player Even can go to a vertex currently good for Even
            onestep_winner = 1;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 0) {
                    // good for player Even
                    onestep_winner = 0;
                    // and set the strategy
                    str = to;
                    break;
                }
            }
        } else {
            // see if player Odd can go to a vertex currently good for Odd
            onestep_winner = 0;
            for (auto curedge = outs(i); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                const int winner_to = parity[to] ^ distraction[to];
                if (winner_to == 1) {
                    // good for player Odd
                    onestep_winner = 1;
                    // and set the strategy
                    str = to;
                    break;
                }
            }
        }

        strategy[i] = str;

        // evaluation stays the same
        if (cur_parity != onestep_winner) {
            Q.push(i); // add to the Queue, because all justified predecessors are now invalid
            distraction[i] = true;
            justified[i] = true;
            blockchanged = true;
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "\033[38;5;165;1mjustified*\033[m " << label_vertex(i);
                if (strategy[i] != -1) logger << " => " << label_vertex(strategy[i]);
                logger << std::endl;
            }
#endif
        }

        i++;
    }

    // done
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        const int winner = parity[v] ^ distraction[v];
        Solver::solve(v, winner, winner == owner(v) ? strategy[v] : -1);
    }

    // free allocated data structures
    delete[] strategy;

    logger << "solved with " << iterations << " iterations." << std::endl;
}